

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O0

void device_start(device_data *d,nni_aio *user)

{
  device_path *pdVar1;
  device_path *p;
  int i;
  nni_aio *user_local;
  device_data *d_local;
  
  d->user = user;
  for (p._4_4_ = 0; p._4_4_ < d->num_paths; p._4_4_ = p._4_4_ + 1) {
    pdVar1 = d->paths + p._4_4_;
    pdVar1->state = 1;
    nni_sock_recv(pdVar1->src,&pdVar1->aio);
    d->running = d->running + 1;
  }
  return;
}

Assistant:

static void
device_start(device_data *d, nni_aio *user)
{
	d->user = user;
	for (int i = 0; i < d->num_paths; i++) {
		device_path *p = &d->paths[i];
		p->state       = NNI_DEVICE_STATE_RECV;
		nni_sock_recv(p->src, &p->aio);
		d->running++;
	}
}